

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecsMinor.hpp
# Opt level: O3

void __thiscall sciplot::TicsSpecsMinor::TicsSpecsMinor(TicsSpecsMinor *this,string *axis)

{
  pointer pcVar1;
  runtime_error *this_00;
  
  (this->super_ShowSpecsOf<sciplot::TicsSpecsMinor>).m_show = true;
  *(undefined ***)&this->super_ShowSpecsOf<sciplot::TicsSpecsMinor> = &PTR__TicsSpecsMinor_001a6010;
  (this->m_axis)._M_dataplus._M_p = (pointer)&(this->m_axis).field_2;
  pcVar1 = (axis->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_axis,pcVar1,pcVar1 + axis->_M_string_length);
  (this->m_frequency)._M_dataplus._M_p = (pointer)&(this->m_frequency).field_2;
  (this->m_frequency)._M_string_length = 0;
  (this->m_frequency).field_2._M_local_buf[0] = '\0';
  if (axis->_M_string_length != 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "You have provided an empty string in `axis` argument of constructor TicsSpecsMinor(axis)."
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline TicsSpecsMinor::TicsSpecsMinor(std::string axis)
: m_axis(axis)
{
    if(axis.empty())
        throw std::runtime_error("You have provided an empty string "
            "in `axis` argument of constructor TicsSpecsMinor(axis).");
}